

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall TPZFMatrix<double>::Decompose_LU(TPZFMatrix<double> *this)

{
  int iVar1;
  long *in_RDI;
  list<long,_std::allocator<long>_> fake;
  undefined1 local_20 [32];
  
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)0x1221be2);
  iVar1 = (**(code **)(*in_RDI + 0xb0))(in_RDI,local_20);
  std::__cxx11::list<long,_std::allocator<long>_>::~list
            ((list<long,_std::allocator<long>_> *)0x1221c08);
  return iVar1;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU() {
    
    std::list<int64_t> fake;
    return this->Decompose_LU(fake);
}